

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_trd.cpp
# Opt level: O1

ETrdFileName TRD_FileNameToBytes(char *inputName,byte *binName,int *nameL)

{
  int iVar1;
  uint uVar2;
  ETrdFileName EVar3;
  char *pcVar4;
  byte *pbVar5;
  int iVar6;
  byte bVar7;
  long lVar8;
  
  pcVar4 = strrchr(inputName,0x2e);
  iVar6 = (int)pcVar4 - (int)inputName;
  if (7 < iVar6) {
    iVar6 = 8;
  }
  if (pcVar4 == (char *)0x0) {
    iVar6 = 8;
  }
  *nameL = 0;
  bVar7 = *inputName;
  if (0 < iVar6 && bVar7 != '\0') {
    lVar8 = 0;
    do {
      binName[lVar8] = bVar7;
      iVar1 = *nameL;
      lVar8 = (long)iVar1 + 1;
      *nameL = (int)lVar8;
      if (iVar6 <= (int)lVar8) break;
      bVar7 = inputName[(long)iVar1 + 1];
    } while (bVar7 != '\0');
  }
  iVar6 = *nameL;
  while (iVar6 < 8) {
    *nameL = iVar6 + 1;
    binName[iVar6] = ' ';
    iVar6 = *nameL;
  }
  if ((pcVar4 != (char *)0x0) && (bVar7 = pcVar4[1], bVar7 != '\0')) {
    pbVar5 = (byte *)(pcVar4 + 2);
    do {
      if (10 < (long)*nameL) break;
      binName[*nameL] = bVar7;
      *nameL = *nameL + 1;
      bVar7 = *pbVar5;
      pbVar5 = pbVar5 + 1;
    } while (bVar7 != '\0');
  }
  while( true ) {
    uVar2 = *nameL;
    if ((uVar2 | 2) == 0xb) break;
    *nameL = uVar2 + 1;
    binName[(int)uVar2] = ' ';
  }
  if ((int)uVar2 < 0xc) {
    memset(binName + (int)uVar2,0,(ulong)(0xb - uVar2) + 1);
  }
  EVar3 = THREE_LETTER_EXTENSION;
  if ((*nameL < 10) &&
     ((0x21 < binName[8] - 0x23 ||
      (EVar3 = OK, (0x380000001U >> ((ulong)(binName[8] - 0x23) & 0x3f) & 1) == 0)))) {
    EVar3 = INVALID_EXTENSION;
  }
  return EVar3;
}

Assistant:

ETrdFileName TRD_FileNameToBytes(const char* inputName, byte binName[12], int & nameL) {
	constexpr int baseSz = int(STrdFile::NAME_BASE_SZ);	// pre-cast to `int` (vs `nameL`)
	const char* ext = strrchr(inputName, '.');
	const int maxL = std::min(baseSz, ext ? int(ext-inputName) : baseSz);
	nameL = 0;
	while (inputName[nameL] && nameL < maxL) {
		binName[nameL] = inputName[nameL];
		++nameL;
	}
	while (nameL < baseSz) binName[nameL++] = ' ';
	while (ext && ext[1] && nameL < int(STrdFile::NAME_ALT_FULL_SZ)) {
		binName[nameL] = ext[1];
		++nameL;
		++ext;
	}
	while (STrdFile::NAME_FULL_SZ != nameL && STrdFile::NAME_ALT_FULL_SZ != nameL) {
		binName[nameL++] = ' ';		// the file name is either 8+1 or 8+3 (not 8+2)
	}
	int fillIdx = nameL;
	while (fillIdx < 12) binName[fillIdx++] = 0;
	if (int(STrdFile::NAME_FULL_SZ) < nameL) return THREE_LETTER_EXTENSION;
	switch (binName[baseSz]) {
		case 'B': case 'C': case 'D': case '#':
			return OK;
	}
	return INVALID_EXTENSION;
}